

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::setCOMTarget
          (InverseKinematics *this,Span<const_double,__1L> desiredPosition,double weight)

{
  index_type iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  InverseKinematics *in_RDI;
  bool bVar2;
  bool ok;
  int expected_pos_size;
  Position *in_stack_ffffffffffffff98;
  Position local_48 [27];
  undefined1 local_2d;
  undefined4 local_2c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_2c = 3;
  local_18 = in_RSI;
  local_10 = in_RDX;
  iVar1 = Span<const_double,_-1L>::size((Span<const_double,__1L> *)0x16b7b5);
  bVar2 = iVar1 == 3;
  local_2d = bVar2;
  if (bVar2) {
    iDynTree::Position::Position(local_48,local_18,local_10);
    setCOMTarget(in_RDI,in_stack_ffffffffffffff98,7.35631632390636e-318);
  }
  else {
    iDynTree::reportError("InverseKinematics","setCOMTarget","Wrong size in input desiredPosition");
  }
  return bVar2;
}

Assistant:

bool InverseKinematics::setCOMTarget(iDynTree::Span<const double> desiredPosition, double weight)
    {
        constexpr int expected_pos_size = 3;
        bool ok = (desiredPosition.size() == expected_pos_size);
        if( !ok )
        {
            reportError("InverseKinematics","setCOMTarget","Wrong size in input desiredPosition");
            return false;
        }

        this->setCOMTarget(Position(desiredPosition), weight);

        return true;
    }